

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

uint util::sleep(uint __seconds)

{
  uint uVar1;
  ulong uVar2;
  double in_XMM0_Qa;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 local_30 [8];
  timespec ts;
  unsigned_long nsec;
  unsigned_long sec;
  double seconds_local;
  
  local_30 = (undefined1  [8])
             ((long)in_XMM0_Qa |
             (long)(in_XMM0_Qa - 9.223372036854776e+18) & (long)in_XMM0_Qa >> 0x3f);
  auVar4._8_4_ = (int)((ulong)local_30 >> 0x20);
  auVar4._0_8_ = local_30;
  auVar4._12_4_ = 0x45300000;
  dVar3 = (in_XMM0_Qa -
          ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,SUB84(local_30,0)) - 4503599627370496.0))) * 1000000000.0;
  uVar2 = (ulong)dVar3;
  ts.tv_sec = uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  ts.tv_nsec = ts.tv_sec;
  uVar1 = nanosleep((timespec *)local_30,(timespec *)0x0);
  return uVar1;
}

Assistant:

void sleep(double seconds)
{
#ifdef WIN32
	Sleep(int(seconds * 1000.0));
#else // WIN32
	unsigned long sec = seconds;
	unsigned long nsec = (seconds - double(sec)) * 1000000000.0;
	timespec ts = {time_t(sec), long(nsec)};
	nanosleep(&ts, 0);
#endif // WIN32
}